

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void update_vertex_color_shader(float t,float *vertex_colors)

{
  long lVar1;
  int iVar2;
  double dVar3;
  
  lVar1 = 0;
  while (lVar1 != 6) {
    dVar3 = sin((double)((float)(int)lVar1 + t));
    iVar2 = (int)(lVar1 + 1);
    vertex_colors[lVar1] = (float)((dVar3 + 1.0) * 0.5 * 0.5 + 0.5);
    dVar3 = sin((double)((float)iVar2 + t));
    vertex_colors[lVar1 + 1] = (float)((dVar3 + 1.0) * 0.5 * 0.5 + 0.5);
    dVar3 = sin((double)((float)(iVar2 + 1) + t));
    vertex_colors[lVar1 + 2] = (float)((dVar3 + 1.0) * 0.5 * 0.5 + 0.5);
    vertex_colors[lVar1 + 3] = 1.0;
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

void update_vertex_color_shader(float t, float vertex_colors[24])
{
    for(int i = 0; i < 6; ++i)
    {
        vertex_colors[i] = 0.5f + 0.5f*(1 + sin(t + (i)))/2;
        vertex_colors[i+1] = 0.5f + 0.5f*(1 + sin(t + (i+1)))/2;
        vertex_colors[i+2] = 0.5f + 0.5f*(1 + sin(t + (i+2)))/2;
        vertex_colors[i+3] = 1.0f;
    }
}